

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.h
# Opt level: O2

void __thiscall cfd::core::SigHashType::SigHashType(SigHashType *this)

{
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = kSigHashAll;
  this->is_anyone_can_pay_ = false;
  this->is_fork_id_ = false;
  return;
}

Assistant:

class CFD_CORE_EXPORT SigHashType {
 public:
  /**
   * @brief SIGHASH_FORKID flag
   */
  const uint8_t kSigHashForkId = 0x40;
  /**
   * @brief SIGHASH_RANGEPROOF flag
   */
  const uint8_t kSigHashRangeproof = 0x40;

  // for feature
  /**
   * @brief SIGHASH_ANYONECANPAY flag
   */
  const uint8_t kSigHashAnyOneCanPay = 0x80;

  /**
   * @brief Create by SigHash flag.
   * @param[in] flag  SigHash flag
   * @param[in] is_append_anyone_can_pay add SIGHASH_ANYONECANPAY if true.
   * @param[in] is_append_fork_id add SIGHASH_FORKID if true.
   * @return SigHashType
   */
  static SigHashType Create(
      uint8_t flag, bool is_append_anyone_can_pay = false,
      bool is_append_fork_id = false);

  /**
   * @brief default constructor.
   */
  SigHashType();

  /**
   * @brief constructor.
   * @param algorithm Sighash algorithm
   * @param is_anyone_can_pay SIGHASH_ANYONECANPAY flag
   * @param is_fork_id SIGHASH_FORKID flag
   */
  explicit SigHashType(
      SigHashAlgorithm algorithm, bool is_anyone_can_pay = false,
      bool is_fork_id = false);
  /**
   * @brief copy constructor.
   * @param[in] sighash_type        SigHashType
   */
  SigHashType(const SigHashType &sighash_type);
  /**
   * @brief copy constructor.
   * @param[in] sighash_type        SigHashType
   * @return SigHashType
   */
  SigHashType &operator=(const SigHashType &sighash_type);

  /**
   * @brief Get a SigHash flag.
   * @return SigHash flag
   */
  uint32_t GetSigHashFlag() const;

  /**
   * @brief Get SigHash algorithm.
   * @return SigHash algorithm
   */
  SigHashAlgorithm GetSigHashAlgorithm() const;
  /**
   * @brief has SIGHASH_ANYONECANPAY flag.
   * @retval true  set SIGHASH_ANYONECANPAY
   * @retval false unuse SIGHASH_ANYONECANPAY
   */
  bool IsAnyoneCanPay() const;
  /**
   * @brief has SIGHASH_FORKID flag.
   * @retval true  set SIGHASH_FORKID
   * @retval false unuse SIGHASH_FORKID
   */
  bool IsForkId() const;
  /**
   * @brief has SIGHASH_RANGEPROOF flag.
   * @retval true  set SIGHASH_RANGEPROOF
   * @retval false unuse SIGHASH_RANGEPROOF
   */
  bool IsRangeproof() const;

  /**
   * @brief Valid sighash state.
   * @retval true   valid
   * @retval false  invalid
   */
  bool IsValid() const;

  /**
   * @brief Set parameter from SigHash flag.
   * @param[in] flag  SigHash flag
   */
  void SetFromSigHashFlag(uint8_t flag);
  /**
   * @brief Set SIGHASH_ANYONECANPAY flag.
   * @param[in] is_anyone_can_pay SIGHASH_ANYONECANPAY flag
   */
  void SetAnyoneCanPay(bool is_anyone_can_pay);
  /**
   * @brief Set SIGHASH_RANGEPROOF flag.
   * @param[in] is_rangeproof SIGHASH_RANGEPROOF flag
   */
  void SetRangeproof(bool is_rangeproof);

  /**
   * @brief Get string.
   * @return SigHashType string.
   */
  std::string ToString() const;

 private:
  /**
   * @brief Sighash algorithm
   */
  SigHashAlgorithm hash_algorithm_;

  /**
   * @brief SIGHASH_ANYONECANPAY flag
   */
  bool is_anyone_can_pay_;

  /**
   * @brief SIGHASH_FORKID flag
   */
  bool is_fork_id_;
}